

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parse(Parser *this,Tokenizer *tokenizer,bool virtualFile,path *name)

{
  undefined1 auVar1 [16];
  byte bVar2;
  bool bVar3;
  size_type sVar4;
  size_t sVar5;
  undefined7 in_register_00000011;
  undefined8 in_R8;
  initializer_list<const_char_*> local_60;
  undefined1 local_49;
  undefined1 local_48 [8];
  FileEntry entry;
  path *name_local;
  bool virtualFile_local;
  Tokenizer *tokenizer_local;
  Parser *this_local;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *sequence;
  
  bVar2 = (byte)name & 1;
  entry._16_8_ = in_R8;
  sVar4 = std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>::size
                    ((vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_> *)tokenizer);
  if (sVar4 < 0x96) {
    local_48 = (undefined1  [8])CONCAT71(in_register_00000011,virtualFile);
    entry.tokenizer._0_1_ = bVar2;
    if ((((ulong)name & 1) != 0) ||
       (bVar3 = ghc::filesystem::path::empty((path *)entry._16_8_), bVar3)) {
      entry.tokenizer._4_4_ = 0xffffffff;
    }
    else {
      sVar5 = FileList::size(&Global.fileList);
      entry.tokenizer._4_4_ = (undefined4)sVar5;
      FileList::add(&Global.fileList,(path *)entry._16_8_);
    }
    std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>::push_back
              ((vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_> *)tokenizer,
               (value_type *)local_48);
    local_49 = 0;
    std::initializer_list<const_char_*>::initializer_list(&local_60);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_60._M_array;
    parseCommandSequence(this,(char)tokenizer,(initializer_list<const_char_*>)(auVar1 << 0x40));
    std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>::pop_back
              ((vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_> *)tokenizer);
  }
  else {
    Logger::queueError<>(Error,"Max include/recursion depth reached");
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
               (nullptr_t)0x0);
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parse(Tokenizer* tokenizer, bool virtualFile, const fs::path& name)
{
	if (entries.size() >= 150)
	{
		Logger::queueError(Logger::Error, "Max include/recursion depth reached");
		return nullptr;
	}

	FileEntry entry;
	entry.tokenizer = tokenizer;
	entry.virtualFile = virtualFile;

	if (!virtualFile && !name.empty())
	{
		entry.fileNum = (int) Global.fileList.size();
		Global.fileList.add(name);
	} else {
		entry.fileNum = -1;
	}

	entries.push_back(entry);

	std::unique_ptr<CAssemblerCommand> sequence = parseCommandSequence();
	entries.pop_back();

	return sequence;
}